

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O1

void __thiscall ON_XMLNode::RemoveAllProperties(ON_XMLNode *this)

{
  ON_XMLNodePrivate *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  recursive_mutex *__mutex;
  ON_XMLProperty *pDelete;
  ON_XMLProperty *pOVar3;
  
  __mutex = &this->_private->m_mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    pOVar1 = this->_private;
    pOVar3 = pOVar1->m_first_property;
    if (pOVar3 != (ON_XMLProperty *)0x0) {
      do {
        iVar2 = (*pOVar3->_vptr_ON_XMLProperty[5])(pOVar3);
        (*pOVar3->_vptr_ON_XMLProperty[1])(pOVar3);
        pOVar3 = (ON_XMLProperty *)CONCAT44(extraout_var,iVar2);
      } while ((ON_XMLProperty *)CONCAT44(extraout_var,iVar2) != (ON_XMLProperty *)0x0);
      pOVar1->m_first_property = (ON_XMLProperty *)0x0;
    }
    ON_XMLNodePrivate::AddEmptyDefaultProperty(this->_private);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void ON_XMLNode::RemoveAllProperties(void)
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  _private->RemoveAllProperties();
  _private->AddEmptyDefaultProperty();
}